

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O1

bool __thiscall xla::GraphCycles::InsertEdge(GraphCycles *this,int32_t x,int32_t y)

{
  int iVar1;
  Rep *r;
  pointer pNVar2;
  iterator iVar3;
  int *piVar4;
  pointer piVar5;
  bool bVar6;
  bool bVar7;
  int *piVar8;
  pointer piVar9;
  long lVar10;
  long lVar11;
  OrderedNodeSet *this_00;
  pointer pNVar12;
  int local_44;
  OrderedSet<int> *local_40;
  int local_34;
  
  if (x == y) {
    bVar7 = false;
  }
  else {
    r = this->rep_;
    this_00 = &(r->node_io_).
               super__Vector_base<xla::(anonymous_namespace)::NodeIO,_std::allocator<xla::(anonymous_namespace)::NodeIO>_>
               ._M_impl.super__Vector_impl_data._M_start[x].out;
    bVar6 = OrderedSet<int>::Insert(this_00,y);
    bVar7 = true;
    if (bVar6) {
      pNVar12 = (r->node_io_).
                super__Vector_base<xla::(anonymous_namespace)::NodeIO,_std::allocator<xla::(anonymous_namespace)::NodeIO>_>
                ._M_impl.super__Vector_impl_data._M_start + y;
      local_40 = this_00;
      OrderedSet<int>::Insert(&pNVar12->in,x);
      pNVar2 = (r->nodes_).
               super__Vector_base<xla::(anonymous_namespace)::Node,_std::allocator<xla::(anonymous_namespace)::Node>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (pNVar2[y].rank < pNVar2[x].rank) {
        bVar7 = ForwardDFS(r,y,pNVar2[x].rank);
        if (!bVar7) {
          OrderedSet<int>::Erase(local_40,y);
          OrderedSet<int>::Erase(&pNVar12->in,x);
          piVar8 = (r->deltaf_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar4 = (r->deltaf_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          if (piVar8 != piVar4) {
            pNVar2 = (r->nodes_).
                     super__Vector_base<xla::(anonymous_namespace)::Node,_std::allocator<xla::(anonymous_namespace)::Node>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            do {
              pNVar2[*piVar8].visited = false;
              piVar8 = piVar8 + 1;
            } while (piVar8 != piVar4);
          }
          return false;
        }
        iVar1 = pNVar2[y].rank;
        piVar9 = (r->deltab_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((r->deltab_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish != piVar9) {
          (r->deltab_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
          ._M_finish = piVar9;
        }
        piVar9 = (r->stack_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((r->stack_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish != piVar9) {
          (r->stack_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = piVar9;
        }
        iVar3._M_current =
             (r->stack_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_44 = x;
        if (iVar3._M_current ==
            (r->stack_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&r->stack_,iVar3,&local_44);
        }
        else {
          *iVar3._M_current = x;
          (r->stack_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = iVar3._M_current + 1;
        }
        local_40 = (OrderedSet<int> *)&r->deltab_;
        piVar9 = (r->stack_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if ((r->stack_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start != piVar9) {
          do {
            local_44 = piVar9[-1];
            (r->stack_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = piVar9 + -1;
            pNVar2 = (r->nodes_).
                     super__Vector_base<xla::(anonymous_namespace)::Node,_std::allocator<xla::(anonymous_namespace)::Node>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if (pNVar2[local_44].visited == false) {
              pNVar2[local_44].visited = true;
              iVar3._M_current =
                   (r->deltab_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar3._M_current ==
                  (r->deltab_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          ((vector<int,std::allocator<int>> *)local_40,iVar3,&local_44);
              }
              else {
                *iVar3._M_current = local_44;
                (r->deltab_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish = iVar3._M_current + 1;
              }
              pNVar12 = (r->node_io_).
                        super__Vector_base<xla::(anonymous_namespace)::NodeIO,_std::allocator<xla::(anonymous_namespace)::NodeIO>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              piVar4 = *(pointer *)
                        ((long)&pNVar12[local_44].in.value_sequence_.
                                super__Vector_base<int,_std::allocator<int>_> + 8);
              for (piVar8 = *(int **)&pNVar12[local_44].in.value_sequence_.
                                      super__Vector_base<int,_std::allocator<int>_>;
                  piVar8 != piVar4; piVar8 = piVar8 + 1) {
                local_34 = *piVar8;
                pNVar2 = (r->nodes_).
                         super__Vector_base<xla::(anonymous_namespace)::Node,_std::allocator<xla::(anonymous_namespace)::Node>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                if ((pNVar2[local_34].visited == false) && (iVar1 < pNVar2[local_34].rank)) {
                  iVar3._M_current =
                       (r->stack_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish;
                  if (iVar3._M_current ==
                      (r->stack_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
                    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                              ((vector<int,std::allocator<int>> *)&r->stack_,iVar3,&local_34);
                  }
                  else {
                    *iVar3._M_current = local_34;
                    (r->stack_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish = iVar3._M_current + 1;
                  }
                }
              }
            }
            piVar9 = (r->stack_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          } while ((r->stack_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start != piVar9);
        }
        Sort(&r->nodes_,&local_40->value_sequence_);
        Sort(&r->nodes_,&r->deltaf_);
        piVar9 = (r->list_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((r->list_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_finish != piVar9) {
          (r->list_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = piVar9;
        }
        MoveToList(r,&local_40->value_sequence_,&r->list_);
        MoveToList(r,&r->deltaf_,&r->list_);
        std::vector<int,_std::allocator<int>_>::resize
                  (&r->merged_,
                   ((long)(r->deltaf_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)(r->deltaf_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start >> 2) +
                   ((long)(r->deltab_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)(r->deltab_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start >> 2));
        std::
        __merge<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  ((r->deltab_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   (r->deltab_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,
                   (r->deltaf_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   (r->deltaf_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,
                   (r->merged_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start);
        piVar9 = (r->list_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar10 = (long)(r->list_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)piVar9;
        if (lVar10 != 0) {
          lVar10 = lVar10 >> 2;
          pNVar2 = (r->nodes_).
                   super__Vector_base<xla::(anonymous_namespace)::Node,_std::allocator<xla::(anonymous_namespace)::Node>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          piVar5 = (r->merged_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar11 = 0;
          do {
            pNVar2[piVar9[lVar11]].rank = piVar5[lVar11];
            lVar11 = lVar11 + 1;
          } while (lVar10 + (ulong)(lVar10 == 0) != lVar11);
        }
      }
      bVar7 = true;
    }
  }
  return bVar7;
}

Assistant:

bool GraphCycles::InsertEdge(int32_t x, int32_t y) {
  if (x == y) return false;
  Rep* r = rep_;
  NodeIO* nx_io = &r->node_io_[x];
  if (!nx_io->out.Insert(y)) {
    // Edge already exists.
    return true;
  }

  NodeIO* ny_io = &r->node_io_[y];
  ny_io->in.Insert(x);

  Node* nx = &r->nodes_[x];
  Node* ny = &r->nodes_[y];
  if (nx->rank <= ny->rank) {
    // New edge is consistent with existing rank assignment.
    return true;
  }

  // Current rank assignments are incompatible with the new edge.  Recompute.
  // We only need to consider nodes that fall in the range [ny->rank,nx->rank].
  if (!ForwardDFS(r, y, nx->rank)) {
    // Found a cycle.  Undo the insertion and tell caller.
    nx_io->out.Erase(y);
    ny_io->in.Erase(x);
    // Since we do not call Reorder() on this path, clear any visited
    // markers left by ForwardDFS.
    ClearVisitedBits(r, r->deltaf_);
    return false;
  }
  BackwardDFS(r, x, ny->rank);
  Reorder(r);
  return true;
}